

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

AnsiPortListSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::AnsiPortListSyntax,slang::syntax::AnsiPortListSyntax_const&>
          (BumpAllocator *this,AnsiPortListSyntax *args)

{
  AnsiPortListSyntax *pAVar1;
  AnsiPortListSyntax *in_RSI;
  size_t in_RDI;
  size_t unaff_retaddr;
  
  pAVar1 = (AnsiPortListSyntax *)allocate((BumpAllocator *)args,unaff_retaddr,in_RDI);
  slang::syntax::AnsiPortListSyntax::AnsiPortListSyntax(in_RSI,pAVar1);
  return pAVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }